

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

void __thiscall
wabt::ObjdumpLocalNames::Set
          (ObjdumpLocalNames *this,Index function_index,Index param_2,string_view name)

{
  mapped_type *this_00;
  allocator<char> local_59;
  key_type local_58;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string local_40 [32];
  
  local_50._M_str = name._M_str;
  local_50._M_len = name._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_40,&local_50,&local_59);
  local_58.first = function_index;
  local_58.second = param_2;
  this_00 = std::
            map<std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->names,&local_58);
  std::__cxx11::string::operator=((string *)this_00,local_40);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void ObjdumpLocalNames::Set(Index function_index,
                            Index local_index,
                            std::string_view name) {
  names[std::pair<Index, Index>(function_index, local_index)] =
      std::string(name);
}